

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileParser::getMaterialDesc(ObjFileParser *this)

{
  byte *pbVar1;
  Model *pMVar2;
  mapped_type pMVar3;
  bool bVar4;
  uint uVar5;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var6;
  iterator iVar7;
  Logger *this_00;
  Material *pMVar8;
  mapped_type *ppMVar9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t __n;
  bool bVar11;
  string strName;
  key_type local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  string local_448 [32];
  aiString local_428;
  
  _Var6 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var6._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  _Var10 = _Var6;
  if ((byte *)_Var6._M_current == pbVar1) {
    return;
  }
  while (((byte *)_Var10._M_current != pbVar1 &&
         ((0xd < (byte)*_Var10._M_current ||
          ((0x3401U >> ((byte)*_Var10._M_current & 0x1f) & 1) == 0))))) {
    (this->m_DataIt)._M_current = (char *)((byte *)_Var10._M_current + 1);
    _Var10._M_current = (char *)((byte *)_Var10._M_current + 1);
  }
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_488,_Var6._M_current);
  std::__cxx11::string::string(local_448,(string *)&local_488);
  trim_whitespaces<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428,
             (Assimp *)local_448,str);
  std::__cxx11::string::operator=((string *)&local_488,(string *)&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string(local_448);
  pMVar8 = ((this->m_pModel)._M_t.
            super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
            .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
           m_pCurrentMaterial;
  if (pMVar8 == (Material *)0x0) {
    if (local_488._M_string_length == 0) goto LAB_004365ec;
  }
  else {
    bVar11 = local_488._M_string_length == 0;
    __n = 0x3ff;
    if ((local_488._M_string_length & 0xfffffc00) == 0) {
      __n = local_488._M_string_length & 0xffffffff;
    }
    local_428.length = (ai_uint32)__n;
    memcpy(local_428.data,local_488._M_dataplus._M_p,__n);
    local_428.data[__n] = '\0';
    bVar4 = aiString::operator==(&pMVar8->MaterialName,&local_428);
    if (bVar4 || bVar11) goto LAB_004365ec;
  }
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
          ::find(&(((this->m_pModel)._M_t.
                    super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                    .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                  m_MaterialMap)._M_t,&local_488);
  pMVar2 = (this->m_pModel)._M_t.
           super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
           .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
  if (iVar7._M_node == (_Base_ptr)((long)&(pMVar2->m_MaterialMap)._M_t + 8U)) {
    this_00 = DefaultLogger::get();
    std::operator+(&local_468,"OBJ: failed to locate material ",&local_488);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428,
                   &local_468,", creating new material");
    Logger::error(this_00,(char *)CONCAT44(local_428.data._0_4_,local_428.length));
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_468);
    pMVar8 = (Material *)operator_new(0x409c);
    ObjFile::Material::Material(pMVar8);
    ((this->m_pModel)._M_t.
     super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
     _M_t.
     super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
     super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMaterial =
         pMVar8;
    if (local_488._M_string_length < 0x400) {
      pMVar8 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMaterial;
      (pMVar8->MaterialName).length = (int)local_488._M_string_length;
      memcpy((pMVar8->MaterialName).data,local_488._M_dataplus._M_p,local_488._M_string_length);
      *(undefined1 *)((long)(pMVar8->MaterialName).data + local_488._M_string_length) = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&((this->m_pModel)._M_t.
                  super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                  .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                 m_MaterialLib,&local_488);
    pMVar2 = (this->m_pModel)._M_t.
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    pMVar3 = pMVar2->m_pCurrentMaterial;
    ppMVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::operator[](&pMVar2->m_MaterialMap,&local_488);
    *ppMVar9 = pMVar3;
  }
  else {
    pMVar2->m_pCurrentMaterial = *(Material **)(iVar7._M_node + 2);
  }
  bVar11 = needsNewMesh(this,&local_488);
  if (bVar11) {
    createMesh(this,&local_488);
  }
  uVar5 = getMaterialIndex(this,&local_488);
  ((this->m_pModel)._M_t.
   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>._M_t.
   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
   super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh->
  m_uiMaterialIndex = uVar5;
LAB_004365ec:
  _Var10 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                     ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var10._M_current;
  std::__cxx11::string::~string((string *)&local_488);
  return;
}

Assistant:

void ObjFileParser::getMaterialDesc() {
    // Get next data for material data
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if (m_DataIt == m_DataItEnd) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // In some cases we should ignore this 'usemtl' command, this variable helps us to do so
    bool skip = false;

    // Get name
    std::string strName(pStart, &(*m_DataIt));
    strName = trim_whitespaces(strName);
    if (strName.empty())
        skip = true;

    // If the current mesh has the same material, we simply ignore that 'usemtl' command
    // There is no need to create another object or even mesh here
    if ( m_pModel->m_pCurrentMaterial && m_pModel->m_pCurrentMaterial->MaterialName == aiString( strName ) ) {
        skip = true;
    }

    if (!skip) {
        // Search for material
        std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find(strName);
        if (it == m_pModel->m_MaterialMap.end()) {
			// Not found, so we don't know anything about the material except for its name.
			// This may be the case if the material library is missing. We don't want to lose all
			// materials if that happens, so create a new named material instead of discarding it
			// completely.
            ASSIMP_LOG_ERROR("OBJ: failed to locate material " + strName + ", creating new material");
			m_pModel->m_pCurrentMaterial = new ObjFile::Material();
			m_pModel->m_pCurrentMaterial->MaterialName.Set(strName);
			m_pModel->m_MaterialLib.push_back(strName);
			m_pModel->m_MaterialMap[strName] = m_pModel->m_pCurrentMaterial;
        } else {
            // Found, using detected material
            m_pModel->m_pCurrentMaterial = (*it).second;
        }

        if ( needsNewMesh( strName ) ) {
            createMesh( strName );
        }

        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex(strName);
    }

    // Skip rest of line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}